

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::computeQuadTexCoord1DArray
               (vector<float,_std::allocator<float>_> *dst,int layerNdx,float left,float right)

{
  pointer pfVar1;
  float fVar2;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,8);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar2 = (float)layerNdx;
  *pfVar1 = left;
  pfVar1[1] = fVar2;
  pfVar1[2] = left;
  pfVar1[3] = fVar2;
  pfVar1[4] = right;
  pfVar1[5] = fVar2;
  pfVar1[6] = right;
  pfVar1[7] = fVar2;
  return;
}

Assistant:

void computeQuadTexCoord1DArray (std::vector<float>& dst, int layerNdx, float left, float right)
{
	dst.resize(4*2);

	dst[0] = left;	dst[1] = (float)layerNdx;
	dst[2] = left;	dst[3] = (float)layerNdx;
	dst[4] = right;	dst[5] = (float)layerNdx;
	dst[6] = right;	dst[7] = (float)layerNdx;
}